

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::ModeState<duckdb::uhugeint_t,duckdb::ModeStandard<duckdb::uhugeint_t>>,duckdb::uhugeint_t,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  sel_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  uhugeint_t *puVar9;
  ulong uVar10;
  idx_t iVar11;
  ulong uVar12;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar2 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar8 = 0;
      uVar10 = 0;
      do {
        puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar5 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar5 = count;
          }
LAB_01a7c4d5:
          uVar6 = uVar10;
          if (uVar10 < uVar5) {
            puVar9 = (uhugeint_t *)(pdVar2 + uVar10 * 0x10);
            do {
              BaseModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>::
              Execute<duckdb::uhugeint_t,duckdb::ModeState<duckdb::uhugeint_t,duckdb::ModeStandard<duckdb::uhugeint_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>>
                        ((ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_> *
                         )state,puVar9,aggr_input_data);
              uVar10 = uVar10 + 1;
              puVar9 = puVar9 + 1;
              uVar6 = uVar5;
            } while (uVar5 != uVar10);
          }
        }
        else {
          uVar3 = puVar1[uVar8];
          uVar5 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar5 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_01a7c4d5;
          uVar6 = uVar5;
          if ((uVar3 != 0) && (uVar6 = uVar10, uVar10 < uVar5)) {
            puVar9 = (uhugeint_t *)(pdVar2 + uVar10 * 0x10);
            uVar12 = 0;
            do {
              if ((uVar3 >> (uVar12 & 0x3f) & 1) != 0) {
                BaseModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>::
                Execute<duckdb::uhugeint_t,duckdb::ModeState<duckdb::uhugeint_t,duckdb::ModeStandard<duckdb::uhugeint_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>>
                          ((ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_>
                            *)state,puVar9,aggr_input_data);
              }
              uVar12 = uVar12 + 1;
              puVar9 = puVar9 + 1;
              uVar6 = uVar5;
            } while (uVar5 - uVar10 != uVar12);
          }
        }
        uVar8 = uVar8 + 1;
        uVar10 = uVar6;
      } while (uVar8 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      local_78.data = (data_ptr_t)&input->validity;
      local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_78.sel = (SelectionVector *)aggr_input_data;
      TypedModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>::
      ConstantOperation<duckdb::uhugeint_t,duckdb::ModeState<duckdb::uhugeint_t,duckdb::ModeStandard<duckdb::uhugeint_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>>
                ((ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_> *)state,
                 (uhugeint_t *)input->data,(AggregateUnaryInput *)&local_78,count);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar4 = (local_78.sel)->sel_vector;
        iVar11 = 0;
        do {
          iVar7 = iVar11;
          if (psVar4 != (sel_t *)0x0) {
            iVar7 = (idx_t)psVar4[iVar11];
          }
          BaseModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>::
          Execute<duckdb::uhugeint_t,duckdb::ModeState<duckdb::uhugeint_t,duckdb::ModeStandard<duckdb::uhugeint_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>>
                    ((ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_> *)
                     state,(uhugeint_t *)(local_78.data + iVar7 * 0x10),aggr_input_data);
          iVar11 = iVar11 + 1;
        } while (count != iVar11);
      }
    }
    else if (count != 0) {
      psVar4 = (local_78.sel)->sel_vector;
      iVar11 = 0;
      do {
        iVar7 = iVar11;
        if (psVar4 != (sel_t *)0x0) {
          iVar7 = (idx_t)psVar4[iVar11];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar7 >> 6]
             >> (iVar7 & 0x3f) & 1) != 0)) {
          BaseModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>::
          Execute<duckdb::uhugeint_t,duckdb::ModeState<duckdb::uhugeint_t,duckdb::ModeStandard<duckdb::uhugeint_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>>
                    ((ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_> *)
                     state,(uhugeint_t *)(local_78.data + iVar7 * 0x10),aggr_input_data);
        }
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}